

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

void COVER_best_init(COVER_best_t *best)

{
  if (best != (COVER_best_t *)0x0) {
    pthread_mutex_init((pthread_mutex_t *)best,(pthread_mutexattr_t *)0x0);
    pthread_cond_init((pthread_cond_t *)&best->cond,(pthread_condattr_t *)0x0);
    best->liveJobs = 0;
    best->dict = (void *)0x0;
    best->dictSize = 0;
    best->compressedSize = 0xffffffffffffffff;
    (best->parameters).k = 0;
    (best->parameters).d = 0;
    (best->parameters).steps = 0;
    (best->parameters).nbThreads = 0;
    (best->parameters).splitPoint = 0.0;
    (best->parameters).shrinkDict = 0;
    (best->parameters).shrinkDictMaxRegression = 0;
    (best->parameters).zParams.compressionLevel = 0;
    (best->parameters).zParams.notificationLevel = 0;
    *(undefined8 *)&(best->parameters).zParams.dictID = 0;
  }
  return;
}

Assistant:

void COVER_best_init(COVER_best_t *best) {
  if (best==NULL) return; /* compatible with init on NULL */
  (void)ZSTD_pthread_mutex_init(&best->mutex, NULL);
  (void)ZSTD_pthread_cond_init(&best->cond, NULL);
  best->liveJobs = 0;
  best->dict = NULL;
  best->dictSize = 0;
  best->compressedSize = (size_t)-1;
  memset(&best->parameters, 0, sizeof(best->parameters));
}